

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.c
# Opt level: O3

XXH_errorcode XXH32_update(void *state_in,void *input,int len)

{
  BYTE *limit;
  XXH_state32_t *state;
  size_t __n;
  undefined1 (*pauVar1) [16];
  ulong __n_00;
  undefined1 auVar2 [16];
  uint uVar3;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  undefined1 auVar4 [16];
  int iVar11;
  undefined1 auVar9 [16];
  int iVar12;
  undefined1 auVar10 [16];
  int iVar15;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  __n = (size_t)len;
  *(size_t *)state_in = *state_in + __n;
  iVar5 = *(int *)((long)state_in + 0x1c);
  if (len + iVar5 < 0x10) {
    memcpy((void *)((long)state_in + (long)iVar5 + 0x20),input,__n);
    __n_00 = (ulong)(uint)(len + *(int *)((long)state_in + 0x1c));
  }
  else {
    pauVar1 = (undefined1 (*) [16])(__n + (long)input);
    if (iVar5 != 0) {
      memcpy((void *)((long)state_in + (long)iVar5 + 0x20),input,(long)(0x10 - iVar5));
      auVar2 = *(undefined1 (*) [16])((long)state_in + 0x20);
      iVar5 = auVar2._4_4_;
      auVar13._4_4_ = iVar5;
      auVar13._0_4_ = iVar5;
      auVar13._8_4_ = auVar2._12_4_;
      auVar13._12_4_ = auVar2._12_4_;
      uVar3 = auVar2._0_4_ * -0x7a143589 + *(int *)((long)state_in + 0xc);
      uVar6 = iVar5 * -0x7a143589 + *(int *)((long)state_in + 0x10);
      uVar7 = (int)((auVar2._8_8_ & 0xffffffff) * 0x85ebca77) + *(int *)((long)state_in + 0x14);
      uVar8 = (int)((auVar13._8_8_ & 0xffffffff) * 0x85ebca77) + *(int *)((long)state_in + 0x18);
      auVar2._0_4_ = uVar3 >> 0x13;
      auVar2._4_4_ = uVar6 >> 0x13;
      auVar2._8_4_ = uVar7 >> 0x13;
      auVar2._12_4_ = uVar8 >> 0x13;
      auVar4._0_4_ = uVar3 * 0x2000;
      auVar4._4_4_ = uVar6 * 0x2000;
      auVar4._8_4_ = uVar7 * 0x2000;
      auVar4._12_4_ = uVar8 * 0x2000;
      auVar4 = auVar4 | auVar2;
      iVar5 = auVar4._4_4_;
      auVar9._4_4_ = iVar5;
      auVar9._0_4_ = iVar5;
      auVar9._8_4_ = auVar4._12_4_;
      auVar9._12_4_ = auVar4._12_4_;
      *(ulong *)((long)state_in + 0xc) = CONCAT44(iVar5 * -0x61c8864f,auVar4._0_4_ * -0x61c8864f);
      *(int *)((long)state_in + 0x1c) = (int)((auVar4._8_8_ & 0xffffffff) * 0x9e3779b1);
      *(int *)((long)state_in + 0x20) = (int)((auVar9._8_8_ & 0xffffffff) * 0x9e3779b1);
      input = (void *)((long)input + (0x10 - (long)*(int *)((long)state_in + 0x1c)));
      *(undefined4 *)((long)state_in + 0x1c) = 0;
    }
    if (input <= pauVar1 + -1) {
      iVar5 = *(int *)((long)state_in + 0xc);
      iVar11 = *(int *)((long)state_in + 0x10);
      iVar15 = *(int *)((long)state_in + 0x14);
      iVar12 = *(int *)((long)state_in + 0x18);
      do {
        auVar2 = *input;
        uVar3 = auVar2._0_4_ * -0x7a143589 + iVar5;
        uVar6 = auVar2._4_4_ * -0x7a143589 + iVar11;
        uVar7 = (int)((auVar2._8_8_ & 0xffffffff) * 0x85ebca77) + iVar15;
        uVar8 = auVar2._12_4_ * -0x7a143589 + iVar12;
        auVar10._0_4_ = uVar3 >> 0x13;
        auVar10._4_4_ = uVar6 >> 0x13;
        auVar10._8_4_ = uVar7 >> 0x13;
        auVar10._12_4_ = uVar8 >> 0x13;
        auVar14._0_4_ = uVar3 * 0x2000;
        auVar14._4_4_ = uVar6 * 0x2000;
        auVar14._8_4_ = uVar7 * 0x2000;
        auVar14._12_4_ = uVar8 * 0x2000;
        auVar14 = auVar14 | auVar10;
        iVar5 = auVar14._0_4_ * -0x61c8864f;
        iVar15 = (int)((auVar14._8_8_ & 0xffffffff) * 0x9e3779b1);
        iVar11 = auVar14._4_4_ * -0x61c8864f;
        iVar12 = auVar14._12_4_ * -0x61c8864f;
        input = (void *)((long)input + 0x10);
      } while (input <= pauVar1 + -1);
      *(int *)((long)state_in + 0xc) = iVar5;
      *(int *)((long)state_in + 0x10) = iVar11;
      *(int *)((long)state_in + 0x14) = iVar15;
      *(int *)((long)state_in + 0x18) = iVar12;
    }
    if (pauVar1 <= input) {
      return XXH_OK;
    }
    __n_00 = (long)pauVar1 - (long)input;
    memcpy((void *)((long)state_in + 0x20),input,__n_00);
  }
  *(int *)((long)state_in + 0x1c) = (int)__n_00;
  return XXH_OK;
}

Assistant:

XXH_errorcode XXH32_update (void* state_in, const void* input, int len)
{
    XXH_endianess endian_detected = (XXH_endianess)XXH_CPU_LITTLE_ENDIAN;
    
    if ((endian_detected==XXH_littleEndian) || XXH_FORCE_NATIVE_FORMAT)
        return XXH32_update_endian(state_in, input, len, XXH_littleEndian);
    else
        return XXH32_update_endian(state_in, input, len, XXH_bigEndian);
}